

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strfmt.c
# Opt level: O0

int lj_strfmt_putarg(lua_State *L,SBuf *sb,int arg,int retry)

{
  TValue *pTVar1;
  TValue *pTVar2;
  cTValue *pcVar3;
  TValue *pTVar4;
  SFormat sf_00;
  int32_t c;
  GCstr *pGVar5;
  cTValue *pcVar6;
  ulong uVar7;
  void *v;
  int narg_00;
  bool bVar8;
  lua_Number lVar9;
  GCstr *str;
  SBufExt *sbx;
  cTValue *mo;
  char *s;
  MSize len;
  GCcdata *cd_1;
  GCcdata *cd;
  TValue *o;
  undefined1 auStack_f8 [4];
  SFormat sf;
  FormatState fs;
  GCstr *fmt;
  int local_c8;
  int narg;
  int retry_local;
  int arg_local;
  SBuf *sb_local;
  lua_State *L_local;
  
  pTVar1 = L->top;
  pTVar2 = L->base;
  fs._24_8_ = lj_lib_checkstr(L,arg);
  _auStack_f8 = (GCstr *)(fs._24_8_ + 0x18);
  fs.p = (uint8_t *)((long)&(_auStack_f8->nextgc).gcptr64 + (ulong)((GCstr *)fs._24_8_)->len);
  local_c8 = retry;
  narg_00 = arg;
  do {
    while( true ) {
      narg = narg_00;
      sf_00 = lj_strfmt_parse((FormatState *)auStack_f8);
      if (sf_00 == 0) {
        return local_c8;
      }
      if (sf_00 != 2) break;
      lj_buf_putmem(sb,fs.e,(uint)fs.str);
      narg_00 = narg;
    }
    if (sf_00 == 1) {
      pGVar5 = lj_str_new(L,(char *)fs.e,(ulong)(uint)fs.str);
      lj_err_callerv(L,LJ_ERR_STRFMT,pGVar5 + 1);
    }
    narg_00 = narg + 1;
    cd = (GCcdata *)(L->base + narg);
    if ((int)((long)pTVar1 - (long)pTVar2 >> 3) < narg_00) {
      lj_err_arg(L,narg_00,LJ_ERR_NOVAL);
    }
    switch(sf_00 & 0xf) {
    case 3:
      if (((int)(*(anon_struct_8_2_7fa0a05d_for_TValue_4 *)cd).it >> 0xf == -0xb) &&
         ((uVar7 = *(ulong *)cd & 0x7fffffffffff, *(short *)(uVar7 + 10) == 0xb ||
          (*(short *)(uVar7 + 10) == 0xc)))) {
        lj_strfmt_putfxint(sb,sf_00,*(uint64_t *)(uVar7 + 0x10));
      }
      else {
        lVar9 = lj_lib_checknum(L,narg_00);
        lj_strfmt_putfnum_int(sb,sf_00,lVar9);
      }
      break;
    case 4:
      if (((int)(*(anon_struct_8_2_7fa0a05d_for_TValue_4 *)cd).it >> 0xf == -0xb) &&
         ((uVar7 = *(ulong *)cd & 0x7fffffffffff, *(short *)(uVar7 + 10) == 0xb ||
          (*(short *)(uVar7 + 10) == 0xc)))) {
        lj_strfmt_putfxint(sb,sf_00,*(uint64_t *)(uVar7 + 0x10));
      }
      else {
        lVar9 = lj_lib_checknum(L,narg_00);
        lj_strfmt_putfnum_uint(sb,sf_00,lVar9);
      }
      break;
    case 5:
      lVar9 = lj_lib_checknum(L,narg_00);
      lj_strfmt_putfnum(sb,sf_00,lVar9);
      break;
    case 6:
      bVar8 = false;
      if ((int)(*(anon_struct_8_2_7fa0a05d_for_TValue_4 *)cd).it >> 0xf != -5) {
        bVar8 = false;
        if ((int)(*(anon_struct_8_2_7fa0a05d_for_TValue_4 *)cd).it >> 0xf == -0xd) {
          bVar8 = *(char *)((*(ulong *)cd & 0x7fffffffffff) + 10) == '\x03';
        }
        bVar8 = (bool)(bVar8 ^ 1);
      }
      if (((bVar8) && (-1 < local_c8)) &&
         (pcVar6 = lj_meta_lookup(L,(cTValue *)cd,MM_tostring), pcVar6->u64 != 0xffffffffffffffff))
      {
        pcVar3 = L->top;
        L->top = pcVar3 + 1;
        *pcVar3 = *pcVar6;
        pcVar6 = L->top;
        L->top = pcVar6 + 1;
        pcVar6->field_4 = *(anon_struct_8_2_7fa0a05d_for_TValue_4 *)cd;
        lua_call(L,1,1);
        cd = (GCcdata *)(L->base + narg);
        pTVar4 = L->top;
        L->top = pTVar4 + -1;
        *(TValue *)cd = pTVar4[-1];
        if (local_c8 < 2) {
          local_c8 = 1;
          break;
        }
      }
      if ((int)((long)(cd->nextgc).gcptr64 >> 0x2f) == -5) {
        s._4_4_ = *(MSize *)(((cd->nextgc).gcptr64 & 0x7fffffffffff) + 0x14);
        mo = (cTValue *)(((cd->nextgc).gcptr64 & 0x7fffffffffff) + 0x18);
      }
      else if (((int)((long)(cd->nextgc).gcptr64 >> 0x2f) == -0xd) &&
              (*(char *)(((cd->nextgc).gcptr64 & 0x7fffffffffff) + 10) == '\x03')) {
        uVar7 = (cd->nextgc).gcptr64 & 0x7fffffffffff;
        if ((SBuf *)(uVar7 + 0x30) == sb) {
          lj_err_arg(L,narg + 2,LJ_ERR_BUFFER_SELF);
        }
        s._4_4_ = (int)((SBuf *)(uVar7 + 0x30))->w - (int)*(undefined8 *)(uVar7 + 0x58);
        mo = *(cTValue **)(uVar7 + 0x58);
      }
      else {
        pGVar5 = lj_strfmt_obj(L,(cTValue *)cd);
        s._4_4_ = pGVar5->len;
        mo = (cTValue *)(pGVar5 + 1);
      }
      if ((sf_00 & 0x10) == 0) {
        strfmt_putfstrlen(sb,sf_00,(char *)&mo->it64,s._4_4_);
      }
      else {
        strfmt_putquotedlen(sb,(char *)&mo->it64,s._4_4_);
      }
      break;
    case 7:
      c = lj_lib_checkint(L,narg_00);
      lj_strfmt_putfchar(sb,sf_00,c);
      break;
    case 8:
      v = lj_obj_ptr((global_State *)(L->glref).ptr64,(cTValue *)cd);
      lj_strfmt_putptr(sb,v);
    }
  } while( true );
}

Assistant:

int lj_strfmt_putarg(lua_State *L, SBuf *sb, int arg, int retry)
{
  int narg = (int)(L->top - L->base);
  GCstr *fmt = lj_lib_checkstr(L, arg);
  FormatState fs;
  SFormat sf;
  lj_strfmt_init(&fs, strdata(fmt), fmt->len);
  while ((sf = lj_strfmt_parse(&fs)) != STRFMT_EOF) {
    if (sf == STRFMT_LIT) {
      lj_buf_putmem(sb, fs.str, fs.len);
    } else if (sf == STRFMT_ERR) {
      lj_err_callerv(L, LJ_ERR_STRFMT,
		     strdata(lj_str_new(L, fs.str, fs.len)));
    } else {
      TValue *o = &L->base[arg++];
      if (arg > narg)
	lj_err_arg(L, arg, LJ_ERR_NOVAL);
      switch (STRFMT_TYPE(sf)) {
      case STRFMT_INT:
	if (tvisint(o)) {
	  int32_t k = intV(o);
	  if (sf == STRFMT_INT)
	    lj_strfmt_putint(sb, k);  /* Shortcut for plain %d. */
	  else
	    lj_strfmt_putfxint(sb, sf, k);
	  break;
	}
#if LJ_HASFFI
	if (tviscdata(o)) {
	  GCcdata *cd = cdataV(o);
	  if (cd->ctypeid == CTID_INT64 || cd->ctypeid == CTID_UINT64) {
	    lj_strfmt_putfxint(sb, sf, *(uint64_t *)cdataptr(cd));
	    break;
	  }
	}
#endif
	lj_strfmt_putfnum_int(sb, sf, lj_lib_checknum(L, arg));
	break;
      case STRFMT_UINT:
	if (tvisint(o)) {
	  lj_strfmt_putfxint(sb, sf, intV(o));
	  break;
	}
#if LJ_HASFFI
	if (tviscdata(o)) {
	  GCcdata *cd = cdataV(o);
	  if (cd->ctypeid == CTID_INT64 || cd->ctypeid == CTID_UINT64) {
	    lj_strfmt_putfxint(sb, sf, *(uint64_t *)cdataptr(cd));
	    break;
	  }
	}
#endif
	lj_strfmt_putfnum_uint(sb, sf, lj_lib_checknum(L, arg));
	break;
      case STRFMT_NUM:
	lj_strfmt_putfnum(sb, sf, lj_lib_checknum(L, arg));
	break;
      case STRFMT_STR: {
	MSize len;
	const char *s;
	cTValue *mo;
	if (LJ_UNLIKELY(!tvisstr(o) && !tvisbuf(o)) && retry >= 0 &&
	    !tvisnil(mo = lj_meta_lookup(L, o, MM_tostring))) {
	  /* Call __tostring metamethod once. */
	  copyTV(L, L->top++, mo);
	  copyTV(L, L->top++, o);
	  lua_call(L, 1, 1);
	  o = &L->base[arg-1];  /* Stack may have been reallocated. */
	  copyTV(L, o, --L->top);  /* Replace inline for retry. */
	  if (retry < 2) {  /* Global buffer may have been overwritten. */
	    retry = 1;
	    break;
	  }
	}
	if (LJ_LIKELY(tvisstr(o))) {
	  len = strV(o)->len;
	  s = strVdata(o);
#if LJ_HASBUFFER
	} else if (tvisbuf(o)) {
	  SBufExt *sbx = bufV(o);
	  if (sbx == (SBufExt *)sb) lj_err_arg(L, arg+1, LJ_ERR_BUFFER_SELF);
	  len = sbufxlen(sbx);
	  s = sbx->r;
#endif
	} else {
	  GCstr *str = lj_strfmt_obj(L, o);
	  len = str->len;
	  s = strdata(str);
	}
	if ((sf & STRFMT_T_QUOTED))
	  strfmt_putquotedlen(sb, s, len);  /* No formatting. */
	else
	  strfmt_putfstrlen(sb, sf, s, len);
	break;
	}
      case STRFMT_CHAR:
	lj_strfmt_putfchar(sb, sf, lj_lib_checkint(L, arg));
	break;
      case STRFMT_PTR:  /* No formatting. */
	lj_strfmt_putptr(sb, lj_obj_ptr(G(L), o));
	break;
      default:
	lj_assertL(0, "bad string format type");
	break;
      }
    }
  }
  return retry;
}